

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2DataBuilder::setUnicodeVersion(Normalizer2DataBuilder *this,char *v)

{
  uint uVar1;
  uint uVar2;
  undefined8 extraout_RAX;
  int extraout_EDX;
  uint8_t *puVar3;
  uint8_t *puVar4;
  undefined1 *puVar5;
  undefined8 in_R9;
  UVersionInfo version;
  char buffer [20];
  int local_3c;
  undefined1 local_38 [32];
  
  u_versionFromString_63((uint8_t *)&local_3c,v);
  puVar3 = this->unicodeVersion;
  if ((local_3c == *(int *)this->unicodeVersion) || (*(int *)this->unicodeVersion == 0)) {
    *(int *)puVar3 = local_3c;
    return;
  }
  puVar5 = local_38;
  puVar4 = puVar3;
  setUnicodeVersion();
  if (puVar4 != (uint8_t *)0x0) {
    if ((int)*(long *)(puVar4 + 0x18) != 0) {
      if (*(int *)(puVar5 + 0xcc) == 2) {
        uVar2 = *(uint *)(puVar4 + 0x14);
        uVar1 = uVar2;
        if (uVar2 == *(uint *)(puVar5 + 200)) goto LAB_001dcd20;
      }
      else if (*(int *)(puVar5 + 0xcc) == 0) {
        uVar2 = *(uint *)(puVar5 + 200);
        uVar1 = *(uint *)(puVar4 + 0x14);
LAB_001dcd20:
        fprintf(_stderr,
                "error in gennorm2 phase %d: not permitted to override mapping for U+%04lX from phase %d\n"
                ,(ulong)uVar2,(long)extraout_EDX,(ulong)uVar1,in_R9,extraout_RAX,puVar3,v);
        exit(3);
      }
      if (*(long **)puVar4 != (long *)0x0) {
        (**(code **)(**(long **)puVar4 + 8))();
      }
      *(long *)puVar4 = 0;
    }
    *(undefined4 *)(puVar4 + 0x14) = *(undefined4 *)(puVar5 + 200);
  }
  return;
}

Assistant:

void
Normalizer2DataBuilder::setUnicodeVersion(const char *v) {
    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    UVersionInfo version;
    u_versionFromString(version, v);
    if( 0!=memcmp(version, unicodeVersion, U_MAX_VERSION_LENGTH) &&
        0!=memcmp(nullVersion, unicodeVersion, U_MAX_VERSION_LENGTH)
    ) {
        char buffer[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, buffer);
        fprintf(stderr, "gennorm2 error: multiple inconsistent Unicode version numbers %s vs. %s\n",
                buffer, v);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }
    memcpy(unicodeVersion, version, U_MAX_VERSION_LENGTH);
}